

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

int Ses_StoreGetEntry(Ses_Store_t *pStore,word *pTruth,int nVars,int *pArrTimeProfile,char **pSol)

{
  uint uVar1;
  Ses_TimesEntry_t *pSVar2;
  Ses_TruthEntry_t *pSVar3;
  uint uVar4;
  ulong uVar5;
  int pTimes [8];
  int local_58 [10];
  
  uVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar1 = 1;
  }
  if ((int)uVar1 < 1) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 ^ *(int *)(Ses_StoreTableHash_s_Primes + (ulong)((uint)uVar5 & 0xf) * 4) *
                      (int)pTruth[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    uVar5 = (ulong)(uVar4 & 0x3ff);
  }
  pSVar3 = pStore->pEntries[uVar5];
  if (pSVar3 == (Ses_TruthEntry_t *)0x0) {
    return 0;
  }
  do {
    if (pSVar3->nVars == nVars) {
      if ((int)uVar1 < 1) {
LAB_002baa5a:
        pSVar2 = pSVar3->head;
        if (pSVar2 == (Ses_TimesEntry_t *)0x0) {
          return 0;
        }
        break;
      }
      uVar5 = 0;
      while (pSVar3->pTruth[uVar5] == pTruth[uVar5]) {
        uVar5 = uVar5 + 1;
        if (uVar1 == uVar5) goto LAB_002baa5a;
      }
    }
    pSVar3 = pSVar3->next;
    if (pSVar3 == (Ses_TruthEntry_t *)0x0) {
      return 0;
    }
  } while( true );
LAB_002baa76:
  if (pSVar2->pNetwork == (char *)0x0) {
    if (nVars < 1) goto LAB_002baae4;
    uVar5 = 0;
    while (pArrTimeProfile[uVar5] == pSVar2->pArrTimeProfile[uVar5]) {
      uVar5 = uVar5 + 1;
      if ((uint)nVars == uVar5) goto LAB_002baae4;
    }
    pSVar2 = pSVar2->next;
  }
  else {
    memcpy(local_58,pArrTimeProfile,(long)nVars << 2);
    Abc_ExactNormalizeArrivalTimesForNetwork(nVars,local_58,pSVar2->pNetwork);
    if (nVars < 1) {
LAB_002baae4:
      *pSol = pSVar2->pNetwork;
      return 1;
    }
    uVar5 = 0;
    while (local_58[uVar5] == pSVar2->pArrTimeProfile[uVar5]) {
      uVar5 = uVar5 + 1;
      if ((uint)nVars == uVar5) goto LAB_002baae4;
    }
  }
  if (pSVar2 == (Ses_TimesEntry_t *)0x0) {
    return 0;
  }
  goto LAB_002baa76;
}

Assistant:

int Ses_StoreGetEntry( Ses_Store_t * pStore, word * pTruth, int nVars, int * pArrTimeProfile, char ** pSol )
{
    int key;
    Ses_TruthEntry_t * pTEntry;
    Ses_TimesEntry_t * pTiEntry;
    int pTimes[8];

    key = Ses_StoreTableHash( pTruth, nVars );
    pTEntry = pStore->pEntries[key];

    /* find truth table entry */
    while ( pTEntry )
    {
        if ( Ses_StoreTruthEqual( pTEntry, pTruth, nVars ) )
            break;
        else
            pTEntry = pTEntry->next;
    }

    /* no entry found? */
    if ( !pTEntry )
        return 0;

    /* find times entry */
    pTiEntry = pTEntry->head;
    while ( pTiEntry )
    {
        /* found after normalization wrt. to network */
        if ( pTiEntry->pNetwork )
        {
            memcpy( pTimes, pArrTimeProfile, sizeof(int) * nVars );
            Abc_ExactNormalizeArrivalTimesForNetwork( nVars, pTimes, pTiEntry->pNetwork );

            if ( Ses_StoreTimesEqual( pTimes, pTiEntry->pArrTimeProfile, nVars ) )
                break;
        }
        /* found for non synthesized network */
        else if ( Ses_StoreTimesEqual( pArrTimeProfile, pTiEntry->pArrTimeProfile, nVars ) )
            break;
        else
            pTiEntry = pTiEntry->next;
    }

    /* no entry found? */
    if ( !pTiEntry )
        return 0;

    *pSol = pTiEntry->pNetwork;
    return 1;
}